

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_c_string(sexp ctx,char *str,sexp_sint_t slen)

{
  sexp psVar1;
  
  if (str == (char *)0x0) {
    psVar1 = (sexp)&DAT_0000003e;
  }
  else {
    if (slen < 0) {
      slen = strlen(str);
    }
    psVar1 = sexp_make_string_op(ctx,(sexp)0x0,2,(sexp)(slen * 2 + 1),(sexp)&DAT_0000043e);
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
      memcpy((void *)((long)&((psVar1->value).type.cpl)->value +
                     (long)&((psVar1->value).type.name)->value),str,slen);
      (((psVar1->value).type.cpl)->value).flonum_bits
      [(long)&((psVar1->value).type.name)->value + slen] = '\0';
    }
  }
  return psVar1;
}

Assistant:

sexp sexp_c_string (sexp ctx, const char *str, sexp_sint_t slen) {
  sexp_sint_t len;
  sexp s;
  if (str == NULL) return SEXP_FALSE;
  len = ((slen >= 0) ? slen : strlen(str));
  s = sexp_make_string(ctx, sexp_make_fixnum(len), SEXP_VOID);
  if (sexp_exceptionp(s)) return s;
  memcpy(sexp_string_data(s), str, len);
  sexp_string_data(s)[len] = '\0';
  sexp_update_string_index_lookup(ctx, s);
  return s;
}